

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
TransactionContext_SplitTxOutByAddress_Test::~TransactionContext_SplitTxOutByAddress_Test
          (TransactionContext_SplitTxOutByAddress_Test *this)

{
  void *in_RDI;
  
  ~TransactionContext_SplitTxOutByAddress_Test
            ((TransactionContext_SplitTxOutByAddress_Test *)0x22ed78);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(TransactionContext, SplitTxOutByAddress)
{
  std::string tx_hex = "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000";
  // 99500000
  std::vector<Amount> amounts = {
    Amount(int64_t{9000000}), Amount(int64_t{500000})};
  auto el_list = cfd::core::GetElementsAddressFormatList();
  std::vector<Address> addresses = {
    Address("ert1qz33wef9ehrvd7c64p27jf5xtvn50946xeekx50", el_list),
    Address("XWMioJVK77vhKHgnSpaCcSBDgf93LFHzYg", el_list)};

  ConfidentialTransactionContext tx(tx_hex);
  tx.SplitTxOut(0, amounts, addresses);
  EXPECT_EQ(
    "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0401f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000055d4a800374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000001f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000895440001600141462eca4b9b8d8df63550abd24d0cb64e8f2d74601f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a1200017a914d081b8e259b744aa903e1831cfce8956941273ce8700000000",
    tx.GetHex());
}